

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  ostream *poVar1;
  cmUVProcessChainBuilder *pcVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_306;
  allocator_type local_305;
  allocator<char> local_304;
  allocator<char> local_303;
  allocator<char> local_302;
  allocator<char> local_301;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_tree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_list;
  string git;
  string local_2b0;
  string range;
  cmUVProcessChainBuilder builder;
  OutputLogger err;
  _Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> local_1d0;
  CommitParser out;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).OldRevision,"..");
  std::operator+(&range,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_DiffParser.super_LineParser.Line._M_string_length,"rev-list",
             (allocator<char> *)&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_DiffParser.Changes,"--reverse",(allocator<char> *)&err);
  std::__cxx11::string::string((string *)&out.super_DiffParser.DiffField,(string *)&range);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)out.super_DiffParser.CurChange.Path.field_2._M_local_buf,"--",
             (allocator<char> *)&git_diff_tree);
  __l._M_len = 5;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_rev_list,__l,&local_306);
  lVar3 = 0x80;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&out.super_DiffParser.super_LineParser.super_OutputParser._vptr_OutputParser +
               lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string((string *)&out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_DiffParser.super_LineParser.Line._M_string_length,"diff-tree",
             (allocator<char> *)&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_DiffParser.Changes,"--stdin",(allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_DiffParser.DiffField,"--always",(allocator<char> *)&local_306);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)out.super_DiffParser.CurChange.Path.field_2._M_local_buf,"-z",&local_301);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.Rev.Rev._M_string_length,"-r",&local_302);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.Rev.Date._M_string_length,"--pretty=raw",&local_303);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.Rev.Author._M_string_length,"--encoding=utf-8",&local_304);
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_diff_tree,__l_00,&local_305);
  lVar3 = 0xe0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&out.super_DiffParser.super_LineParser.super_OutputParser._vptr_OutputParser +
               lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  cmCTestVC::ComputeCommandLine((string *)&out,&git_rev_list);
  poVar1 = std::operator<<(poVar1,(string *)&out);
  poVar1 = std::operator<<(poVar1," | ");
  cmCTestVC::ComputeCommandLine((string *)&builder,&git_diff_tree);
  poVar1 = std::operator<<(poVar1,(string *)&builder);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&out);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  pcVar2 = cmUVProcessChainBuilder::AddCommand(&builder,&git_rev_list);
  pcVar2 = cmUVProcessChainBuilder::AddCommand(pcVar2,&git_diff_tree);
  std::__cxx11::string::string
            ((string *)&local_2b0,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  cmUVProcessChainBuilder::SetWorkingDirectory(pcVar2,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  CommitParser::CommitParser(&out,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ");
  cmProcessTools::RunProcess
            ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> *)
             &local_1d0,&builder,(OutputParser *)&out,(OutputParser *)&err,UTF8);
  std::_Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::
  ~_Vector_base(&local_1d0);
  (*out.super_DiffParser.super_LineParser.super_OutputParser._vptr_OutputParser[2])(&out,"",1);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  CommitParser::~CommitParser(&out);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_diff_tree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_rev_list);
  std::__cxx11::string::~string((string *)&git);
  std::__cxx11::string::~string((string *)&range);
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_list = { git, "rev-list", "--reverse",
                                            range, "--" };
  std::vector<std::string> git_diff_tree = {
    git,  "diff-tree", "--stdin",      "--always",
    "-z", "-r",        "--pretty=raw", "--encoding=utf-8"
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmUVProcessChainBuilder builder;
  builder.AddCommand(git_rev_list)
    .AddCommand(git_diff_tree)
    .SetWorkingDirectory(this->SourceDirectory);

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(builder, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  return true;
}